

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)600>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  undefined8 interface_00;
  bool bVar1;
  int32_t modelVersion;
  CategoryTypeCase CVar2;
  CoreML *pCVar3;
  OneHotEncoder *pOVar4;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_161;
  string local_160;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_13d;
  TypeCase local_13c;
  iterator local_138;
  size_type local_130;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_128;
  Result local_110;
  byte local_e2;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_e1;
  TypeCase local_e0;
  bool sparse;
  undefined4 uStack_dc;
  iterator local_d8;
  size_type local_d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c8;
  Result local_b0;
  undefined4 local_84;
  ValidationPolicy local_80 [4];
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  ValidationPolicy::ValidationPolicy(local_80);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion,local_80);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    pCVar3 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_e0 = kInt64Type;
    uStack_dc = 3;
    local_d8 = &local_e0;
    local_d0 = 2;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_e1);
    __l_00._M_len = local_d0;
    __l_00._M_array = local_d8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c8,__l_00,&local_e1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_b0,pCVar3,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c8,in_R8);
    Result::operator=((Result *)local_48,&local_b0);
    Result::~Result(&local_b0);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c8);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_e1);
    bVar1 = Result::good((Result *)local_48);
    if (bVar1) {
      pOVar4 = Specification::Model::onehotencoder(format);
      local_e2 = Specification::OneHotEncoder::outputsparse(pOVar4);
      pCVar3 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      local_13c = (local_e2 & 1) + kMultiArrayType;
      local_138 = &local_13c;
      local_130 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_13d);
      __l._M_len = local_130;
      __l._M_array = local_138;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_128,__l,&local_13d);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_110,pCVar3,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_128,
                 in_R8);
      Result::operator=((Result *)local_48,&local_110);
      Result::~Result(&local_110);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_128);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_13d);
      bVar1 = Result::good((Result *)local_48);
      if (bVar1) {
        pOVar4 = Specification::Model::onehotencoder(format);
        CVar2 = Specification::OneHotEncoder::CategoryType_case(pOVar4);
        if (CVar2 == CATEGORYTYPE_NOT_SET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"OneHotEncoder parameter incorrect type",&local_161);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  local_84 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_oneHotEncoder>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1,
                                                             { Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kStringType });
        if (!result.good()) {
            return result;
        }
        
        // If sparse then the input must be dictionary
        bool sparse = format.onehotencoder().outputsparse();

        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {(sparse ? Specification::FeatureType::kDictionaryType : Specification::FeatureType::kMultiArrayType)});
        // Validate the outputs
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        switch (format.onehotencoder().CategoryType_case()) {
            case Specification::OneHotEncoder::kInt64Categories:
                break;
            case Specification::OneHotEncoder::kStringCategories:
                break;
            case Specification::OneHotEncoder::CATEGORYTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "OneHotEncoder parameter incorrect type");
        }

        return result;
    }